

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::Hub::stop(Hub *this)

{
  ssize_t sVar1;
  DashelException *this_00;
  int local_28;
  ssize_t ret;
  void *pvStack_18;
  char c;
  int *terminationPipes;
  Hub *this_local;
  
  pvStack_18 = this->hTerminate;
  ret._7_1_ = 0;
  terminationPipes = (int *)this;
  sVar1 = write(*(int *)((long)pvStack_18 + 4),(void *)((long)&ret + 7),1);
  if (sVar1 != 1) {
    this_00 = (DashelException *)__cxa_allocate_exception(0x20);
    local_28 = (int)sVar1;
    DashelException::DashelException
              (this_00,IOError,local_28,"Cannot write to termination pipe.",(Stream *)0x0);
    __cxa_throw(this_00,&DashelException::typeinfo,DashelException::~DashelException);
  }
  return;
}

Assistant:

void Hub::stop()
	{
		int* terminationPipes = (int*)hTerminate;
		char c = 0;
		const ssize_t ret = write(terminationPipes[1], &c, 1);
		if (ret != 1)
			throw DashelException(DashelException::IOError, ret, "Cannot write to termination pipe.");
	}